

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O3

int x25519_pub_encode(CBB *out,EVP_PKEY *pkey)

{
  uint8_t *data;
  int iVar1;
  CBB key_bitstring;
  CBB spki;
  CBB algorithm;
  CBB local_a0;
  CBB local_70;
  CBB local_40;
  
  data = (uint8_t *)pkey->pkey;
  iVar1 = CBB_add_asn1(out,&local_70,0x20000010);
  if ((((iVar1 != 0) && (iVar1 = CBB_add_asn1(&local_70,&local_40,0x20000010), iVar1 != 0)) &&
      (iVar1 = CBB_add_asn1_element(&local_40,6,x25519_asn1_meth.oid,3), iVar1 != 0)) &&
     (((iVar1 = CBB_add_asn1(&local_70,&local_a0,3), iVar1 != 0 &&
       (iVar1 = CBB_add_u8(&local_a0,'\0'), iVar1 != 0)) &&
      ((iVar1 = CBB_add_bytes(&local_a0,data,0x20), iVar1 != 0 &&
       (iVar1 = CBB_flush(out), iVar1 != 0)))))) {
    return 1;
  }
  ERR_put_error(6,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                ,0x9b);
  return 0;
}

Assistant:

static int x25519_pub_encode(CBB *out, const EVP_PKEY *pkey) {
  const X25519_KEY *key = reinterpret_cast<X25519_KEY *>(pkey->pkey);

  // See RFC 8410, section 4.
  CBB spki, algorithm, key_bitstring;
  if (!CBB_add_asn1(out, &spki, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, x25519_asn1_meth.oid,
                            x25519_asn1_meth.oid_len) ||
      !CBB_add_asn1(&spki, &key_bitstring, CBS_ASN1_BITSTRING) ||
      !CBB_add_u8(&key_bitstring, 0 /* padding */) ||
      !CBB_add_bytes(&key_bitstring, key->pub, 32) ||  //
      !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}